

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::FocusWindow(ImGuiWindow *window)

{
  uint uVar1;
  ImGuiContext *pIVar2;
  ImGuiID IVar3;
  ImGuiWindow *window_00;
  ImGuiContext *g;
  
  pIVar2 = GImGui;
  if (GImGui->NavWindow != window) {
    GImGui->NavWindow = window;
    if (window == (ImGuiWindow *)0x0) {
      pIVar2->NavInitRequest = false;
      IVar3 = 0;
    }
    else {
      if (pIVar2->NavDisableMouseHover == true) {
        pIVar2->NavMousePosDirty = true;
      }
      pIVar2->NavInitRequest = false;
      IVar3 = window->NavLastIds[0];
    }
    pIVar2->NavId = IVar3;
    pIVar2->NavIdIsAlive = false;
    pIVar2->NavLayer = 0;
  }
  if (window != (ImGuiWindow *)0x0) {
    window_00 = window->RootWindow;
    if (window->RootWindow == (ImGuiWindow *)0x0) {
      window_00 = window;
    }
    uVar1 = window_00->Flags;
    if (((((uVar1 >> 0x1a & 1) != 0) && (pIVar2->ActiveId != 0)) &&
        (pIVar2->ActiveIdWindow != (ImGuiWindow *)0x0)) &&
       (pIVar2->ActiveIdWindow->RootWindow != window_00)) {
      pIVar2->ActiveIdIsJustActivated = true;
      pIVar2->ActiveIdAllowOverlap = false;
      pIVar2->ActiveIdTimer = 0.0;
      pIVar2->ActiveId = 0;
      pIVar2->ActiveIdAllowNavDirFlags = 0;
      pIVar2->ActiveIdWindow = (ImGuiWindow *)0x0;
    }
    if ((uVar1 >> 0xd & 1) == 0) {
      BringWindowToFront(window_00);
      return;
    }
  }
  return;
}

Assistant:

void ImGui::FocusWindow(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;

    if (g.NavWindow != window)
    {
        g.NavWindow = window;
        if (window && g.NavDisableMouseHover)
            g.NavMousePosDirty = true;
        g.NavInitRequest = false;
        g.NavId = window ? window->NavLastIds[0] : 0; // Restore NavId
        g.NavIdIsAlive = false;
        g.NavLayer = 0;
        //printf("[%05d] FocusWindow(\"%s\")\n", g.FrameCount, window ? window->Name : NULL);
    }

    // Passing NULL allow to disable keyboard focus
    if (!window)
        return;

    // Move the root window to the top of the pile
    if (window->RootWindow)
        window = window->RootWindow;

    // Steal focus on active widgets
    if (window->Flags & ImGuiWindowFlags_Popup) // FIXME: This statement should be unnecessary. Need further testing before removing it..
        if (g.ActiveId != 0 && g.ActiveIdWindow && g.ActiveIdWindow->RootWindow != window)
            ClearActiveID();

    // Bring to front
    if (!(window->Flags & ImGuiWindowFlags_NoBringToFrontOnFocus))
        BringWindowToFront(window);
}